

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall ThreadContext::TryRedeferral(ThreadContext *this)

{
  ScriptContext *this_00;
  bool bVar1;
  uint inactiveThreshold;
  int iVar2;
  ActiveFunctionSet *pActiveFuncs;
  
  bVar1 = DoRedeferFunctionBodies(this);
  if (bVar1) {
    pActiveFuncs = (ActiveFunctionSet *)
                   new<Memory::ArenaAllocator>(0x20,&this->threadAlloc,0x364470);
    pActiveFuncs->head = (Type)0x0;
    pActiveFuncs->lastFoundIndex = (Type)0x0;
    pActiveFuncs->alloc = &this->threadAlloc;
    pActiveFuncs->lastUsedNodePrevNextField = (Type)pActiveFuncs;
    GetActiveFunctions(this,pActiveFuncs);
    this->redeferredFunctions = 0;
    this->recoveredBytes = 0;
  }
  else {
    pActiveFuncs = (BVSparse<Memory::ArenaAllocator> *)0x0;
  }
  inactiveThreshold = GetRedeferralInactiveThreshold(this);
  for (this_00 = this->scriptContextList; this_00 != (ScriptContext *)0x0; this_00 = this_00->next)
  {
    iVar2 = (*(this_00->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this_00);
    if ((char)iVar2 == '\0') {
      Js::ScriptContext::RedeferFunctionBodies(this_00,pActiveFuncs,inactiveThreshold);
    }
  }
  if (pActiveFuncs != (BVSparse<Memory::ArenaAllocator> *)0x0) {
    BVSparse<Memory::ArenaAllocator>::~BVSparse(pActiveFuncs);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&(this->threadAlloc).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
               pActiveFuncs,0x20);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015b3868,RedeferralPhase);
    if ((bVar1) && (this->redeferredFunctions != 0)) {
      Output::Print(L"Redeferred: %d, Bytes: 0x%x\n",(ulong)this->redeferredFunctions,
                    (ulong)this->recoveredBytes);
      return;
    }
  }
  return;
}

Assistant:

void
ThreadContext::TryRedeferral()
{
    bool doRedefer = this->DoRedeferFunctionBodies();

    // Collect the set of active functions.
    ActiveFunctionSet *pActiveFuncs = nullptr;
    if (doRedefer)
    {
        pActiveFuncs = Anew(this->GetThreadAlloc(), ActiveFunctionSet, this->GetThreadAlloc());
        this->GetActiveFunctions(pActiveFuncs);
#if DBG
        this->redeferredFunctions = 0;
        this->recoveredBytes = 0;
#endif
    }

    uint inactiveThreshold = this->GetRedeferralInactiveThreshold();
    Js::ScriptContext *scriptContext;
    for (scriptContext = GetScriptContextList(); scriptContext; scriptContext = scriptContext->next)
    {
        if (scriptContext->IsClosed())
        {
            continue;
        }
        scriptContext->RedeferFunctionBodies(pActiveFuncs, inactiveThreshold);
    }

    if (pActiveFuncs)
    {
        Adelete(this->GetThreadAlloc(), pActiveFuncs);
#if DBG
        if (PHASE_STATS1(Js::RedeferralPhase) && this->redeferredFunctions)
        {
            Output::Print(_u("Redeferred: %d, Bytes: 0x%x\n"), this->redeferredFunctions, this->recoveredBytes);
        }
#endif
    }
}